

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetime.cpp
# Opt level: O2

BOOL FileTimeToSystemTime(FILETIME *lpFileTime,LPSYSTEMTIME lpSystemTime)

{
  undefined4 uVar1;
  undefined4 uVar2;
  FILETIME FVar3;
  BOOL BVar4;
  tm *ptVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 local_50 [8];
  tm timeBuf;
  
  FVar3 = *lpFileTime;
  if ((ulong)FVar3 < 0x19db1ded53e8001) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    SetLastError(0x57);
    BVar4 = 0;
  }
  else {
    if ((long)((long)FVar3 + 0xfe624e212ac18000U) < 0) {
      timeBuf.tm_zone = (char *)~((0x19db1ded53e7fffU - (long)FVar3) / 10000000);
    }
    else {
      timeBuf.tm_zone = (char *)(((long)FVar3 + 0xfe624e212ac18000U) / 10000000);
    }
    ptVar5 = gmtime_r((time_t *)&timeBuf.tm_zone,(tm *)local_50);
    uVar1 = ptVar5->tm_mon;
    uVar2 = ptVar5->tm_year;
    auVar7._4_4_ = uVar2;
    auVar7._0_4_ = uVar1;
    auVar7._8_8_ = 0;
    auVar8 = pshuflw(auVar7,auVar7,0xe2);
    lpSystemTime->wYear = auVar8._0_2_ + 0x76c;
    lpSystemTime->wMonth = auVar8._2_2_ + 1;
    auVar8._0_4_ = ptVar5->tm_sec;
    auVar8._4_4_ = ptVar5->tm_min;
    auVar8._8_4_ = ptVar5->tm_hour;
    auVar8._12_4_ = ptVar5->tm_mday;
    auVar8 = pshufb(auVar8,_DAT_00166c40);
    uVar6 = auVar8._0_8_;
    lpSystemTime->wDay = (short)uVar6;
    lpSystemTime->wHour = (short)((ulong)uVar6 >> 0x10);
    lpSystemTime->wMinute = (short)((ulong)uVar6 >> 0x20);
    lpSystemTime->wSecond = (short)((ulong)uVar6 >> 0x30);
    BVar4 = 1;
  }
  return BVar4;
}

Assistant:

BOOL PALAPI FileTimeToSystemTime( CONST FILETIME * lpFileTime, 
                                  LPSYSTEMTIME lpSystemTime )
{
    UINT64 FileTime = 0;
    time_t UnixFileTime = 0;
    struct tm * UnixSystemTime = 0;

    /* Combine the file time. */
    FileTime = lpFileTime->dwHighDateTime;
    FileTime <<= 32;
    FileTime |= (UINT)lpFileTime->dwLowDateTime;
    const UINT64 since1601 = SECS_BETWEEN_1601_AND_1970_EPOCHS * SECS_TO_100NS;

    if (FileTime > since1601 && since1601 >= 0) 
    {
        FileTime -= since1601;
#if HAVE_GMTIME_R
        struct tm timeBuf;
#endif  /* HAVE_GMTIME_R */
        /* Convert file time to unix time. */
        if (((INT64)FileTime) < 0)
        {
            UnixFileTime =  -1 - ( ( -FileTime - 1 ) / 10000000 );            
        }
        else
        {
            UnixFileTime = FileTime / 10000000;
        }

        /* Convert unix file time to Unix System time. */
#if HAVE_GMTIME_R
        UnixSystemTime = gmtime_r( &UnixFileTime, &timeBuf );
#else   /* HAVE_GMTIME_R */
        UnixSystemTime = gmtime( &UnixFileTime );
#endif  /* HAVE_GMTIME_R */

        /* Convert unix system time to Windows system time. */
        lpSystemTime->wDay      = UnixSystemTime->tm_mday;
    
        /* Unix time counts January as a 0, under Windows it is 1*/
        lpSystemTime->wMonth    = UnixSystemTime->tm_mon + 1;
        /* Unix time returns the year - 1900, Windows returns the current year*/
        lpSystemTime->wYear     = UnixSystemTime->tm_year + 1900;
        
        lpSystemTime->wSecond   = UnixSystemTime->tm_sec;
        lpSystemTime->wMinute   = UnixSystemTime->tm_min;
        lpSystemTime->wHour     = UnixSystemTime->tm_hour;
        return TRUE;
    }
    else
    {
        ERROR( "The file time is to large.\n" );
        SetLastError(ERROR_INVALID_PARAMETER);
        return FALSE;
    }
}